

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O1

Abc_Cex_t * Gla_ManDeriveCex(Gla_Man_t *p,Vec_Int_t *vPis)

{
  Gia_Obj_t *pGVar1;
  Gia_Man_t *pGVar2;
  Gia_Obj_t *pGVar3;
  sat_solver2 *psVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  Abc_Cex_t *pAVar8;
  int iVar9;
  long lVar10;
  
  iVar9 = p->pGia->nRegs;
  pAVar8 = Abc_CexAlloc(iVar9,p->pGia->vCis->nSize - iVar9,p->pPars->iFrame + 1);
  pAVar8->iPo = 0;
  pAVar8->iFrame = p->pPars->iFrame;
  if (0 < vPis->nSize) {
    lVar10 = 0;
    do {
      iVar9 = vPis->pArray[lVar10];
      if (((long)iVar9 < 0) || (pGVar2 = p->pGia, pGVar2->nObjs <= iVar9)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (pGVar2->pObjs == (Gia_Obj_t *)0x0) {
        return pAVar8;
      }
      pGVar1 = pGVar2->pObjs + iVar9;
      if ((((uint)*(undefined8 *)pGVar1 & 0x9fffffff) == 0x9fffffff) &&
         (uVar7 = (uint)((ulong)*(undefined8 *)pGVar1 >> 0x20),
         (int)(uVar7 & 0x1fffffff) < pGVar2->vCis->nSize - pGVar2->nRegs)) {
        if (pGVar2->vCis->nSize - pGVar2->nRegs <= (int)(uVar7 & 0x1fffffff)) {
          __assert_fail("Gia_ObjIsPi(p->pGia, pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGlaOld.c"
                        ,200,"Abc_Cex_t *Gla_ManDeriveCex(Gla_Man_t *, Vec_Int_t *)");
        }
        if (-1 < pAVar8->iFrame) {
          iVar9 = -1;
          do {
            pGVar3 = p->pGia->pObjs;
            if ((pGVar1 < pGVar3) || (pGVar3 + p->pGia->nObjs <= pGVar1)) {
              __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
            }
            iVar9 = iVar9 + 1;
            iVar5 = (int)((ulong)((long)pGVar1 - (long)pGVar3) >> 2) * -0x55555555;
            iVar6 = Gla_ManCheckVar(p,p->pObj2Obj[iVar5],iVar9);
            if (iVar6 != 0) {
              psVar4 = p->pSat;
              uVar7 = Gla_ManGetVar(p,p->pObj2Obj[iVar5],iVar9);
              if (((int)uVar7 < 0) || (psVar4->size <= (int)uVar7)) {
                __assert_fail("v >= 0 && v < s->size",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.h"
                              ,0xd4,"int sat_solver2_var_value(sat_solver2 *, int)");
              }
              if (psVar4->model[uVar7] == 1) {
                if (-1 < (int)*(undefined8 *)pGVar1) {
                  __assert_fail("pObj->fTerm",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                                ,0x1da,"int Gia_ObjCioId(Gia_Obj_t *)");
                }
                iVar5 = ((uint)((ulong)*(undefined8 *)pGVar1 >> 0x20) & 0x1fffffff) + pAVar8->nRegs
                        + pAVar8->nPis * iVar9;
                (&pAVar8[1].iPo)[iVar5 >> 5] =
                     (&pAVar8[1].iPo)[iVar5 >> 5] | 1 << ((byte)iVar5 & 0x1f);
              }
            }
          } while (iVar9 < pAVar8->iFrame);
        }
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < vPis->nSize);
  }
  return pAVar8;
}

Assistant:

Abc_Cex_t * Gla_ManDeriveCex( Gla_Man_t * p, Vec_Int_t * vPis )
{
    Abc_Cex_t * pCex;
    Gia_Obj_t * pObj;
    int i, f;
    pCex = Abc_CexAlloc( Gia_ManRegNum(p->pGia), Gia_ManPiNum(p->pGia), p->pPars->iFrame+1 );
    pCex->iPo = 0;
    pCex->iFrame = p->pPars->iFrame;
    Gia_ManForEachObjVec( vPis, p->pGia, pObj, i )
    {
        if ( !Gia_ObjIsPi(p->pGia, pObj) )
            continue;
        assert( Gia_ObjIsPi(p->pGia, pObj) );
        for ( f = 0; f <= pCex->iFrame; f++ )
            if ( Gla_ObjSatValue( p, Gia_ObjId(p->pGia, pObj), f ) )
                Abc_InfoSetBit( pCex->pData, pCex->nRegs + f * pCex->nPis + Gia_ObjCioId(pObj) );
    }
    return pCex;
}